

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_package.c
# Opt level: O0

int lj_cf_package_module(lua_State *L)

{
  int iVar1;
  int iVar2;
  lua_State *L_00;
  char *pcVar3;
  lua_State *in_RDI;
  int loaded;
  char *modname;
  lua_State *in_stack_00000018;
  undefined4 in_stack_00000020;
  int in_stack_00000024;
  undefined4 in_stack_00000028;
  int in_stack_0000002c;
  lua_State *in_stack_00000030;
  lua_State *in_stack_00000060;
  undefined4 in_stack_ffffffffffffffe8;
  
  L_00 = (lua_State *)luaL_checklstring((lua_State *)modname,loaded,(size_t *)in_RDI);
  iVar1 = lua_gettop(in_RDI);
  iVar1 = iVar1 + 1;
  lua_getfield(in_stack_00000030,in_stack_0000002c,
               (char *)CONCAT44(in_stack_00000024,in_stack_00000020));
  lua_getfield(in_stack_00000030,in_stack_0000002c,
               (char *)CONCAT44(in_stack_00000024,in_stack_00000020));
  iVar2 = lua_type(in_RDI,(int)((ulong)L_00 >> 0x20));
  if (iVar2 != 5) {
    lua_settop(L_00,iVar1);
    pcVar3 = luaL_findtable(in_stack_00000018,L._4_4_,modname,loaded);
    if (pcVar3 != (char *)0x0) {
      lj_err_callerv(in_RDI,LJ_ERR_BADMODN,L_00);
    }
    lua_pushvalue(in_RDI,(int)((ulong)L_00 >> 0x20));
    lua_setfield((lua_State *)CONCAT44(in_stack_0000002c,in_stack_00000028),in_stack_00000024,
                 (char *)in_stack_00000018);
  }
  lua_getfield(in_stack_00000030,in_stack_0000002c,
               (char *)CONCAT44(in_stack_00000024,in_stack_00000020));
  iVar2 = lua_type(in_RDI,(int)((ulong)L_00 >> 0x20));
  if (iVar2 == 0) {
    lua_settop(L_00,iVar1);
    modinit(L_00,(char *)CONCAT44(iVar1,in_stack_ffffffffffffffe8));
  }
  else {
    lua_settop(L_00,iVar1);
  }
  lua_pushvalue(in_RDI,(int)((ulong)L_00 >> 0x20));
  setfenv(in_stack_00000060);
  dooptions(L_00,iVar1);
  return 0;
}

Assistant:

static int lj_cf_package_module(lua_State *L)
{
  const char *modname = luaL_checkstring(L, 1);
  int loaded = lua_gettop(L) + 1;  /* index of _LOADED table */
  lua_getfield(L, LUA_REGISTRYINDEX, "_LOADED");
  lua_getfield(L, loaded, modname);  /* get _LOADED[modname] */
  if (!lua_istable(L, -1)) {  /* not found? */
    lua_pop(L, 1);  /* remove previous result */
    /* try global variable (and create one if it does not exist) */
    if (luaL_findtable(L, LUA_GLOBALSINDEX, modname, 1) != NULL)
      lj_err_callerv(L, LJ_ERR_BADMODN, modname);
    lua_pushvalue(L, -1);
    lua_setfield(L, loaded, modname);  /* _LOADED[modname] = new table */
  }
  /* check whether table already has a _NAME field */
  lua_getfield(L, -1, "_NAME");
  if (!lua_isnil(L, -1)) {  /* is table an initialized module? */
    lua_pop(L, 1);
  } else {  /* no; initialize it */
    lua_pop(L, 1);
    modinit(L, modname);
  }
  lua_pushvalue(L, -1);
  setfenv(L);
  dooptions(L, loaded - 1);
  return 0;
}